

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O0

bool __thiscall AmpIO::GetAmpEnable(AmpIO *this,uint index)

{
  uint32_t uVar1;
  uint uVar2;
  bool local_1d;
  uint32_t mask;
  bool ret;
  uint index_local;
  AmpIO *this_local;
  
  if (index < this->NumMotors) {
    uVar1 = BoardIO::GetFirmwareVersion((BoardIO *)this);
    if (uVar1 < 8) {
      uVar1 = GetStatus(this);
      uVar2 = uVar1 & 1 << ((byte)index & 0x1f);
    }
    else {
      uVar2 = this->ReadBuffer[this->MOTOR_STATUS_OFFSET + index] & 0x10000000;
    }
    local_1d = uVar2 != 0;
    this_local._7_1_ = local_1d;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool AmpIO::GetAmpEnable(unsigned int index) const
{
    if (index >= NumMotors)
        return false;

    bool ret;
    if (GetFirmwareVersion() < 8) {
        uint32_t mask = (0x00000001 << index);
        ret = GetStatus()&mask;
    }
    else {
        ret = ReadBuffer[MOTOR_STATUS_OFFSET + index] & MSTAT_AMP_REQ;
    }
    return ret;
}